

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncReadAscii(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode mode;
  unsigned_long *puVar4;
  Identifier *args;
  StringLiteral *args_00;
  string local_758;
  StringLiteral local_738;
  long local_718;
  streamsize i;
  long local_708;
  unsigned_long local_700;
  size_t bytesToRead;
  int64_t progress;
  string result;
  char local_6c8 [7];
  bool stringTerminated;
  char buffer [1024];
  fpos<__mbstate_t> local_2c0;
  undefined4 local_2ac;
  undefined1 local_2a8 [8];
  ifstream file;
  int64_t totalSize;
  error_code error;
  path local_78;
  undefined1 local_58 [8];
  path fullName;
  int64_t length;
  int64_t start;
  StringLiteral *fileName;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  fileName = (StringLiteral *)parameters;
  parameters_local = (vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)funcName;
  funcName_local = (Identifier *)__return_storage_ptr__;
  bVar2 = getExpFuncParameter(parameters,0,(StringLiteral **)&start,funcName,false);
  if (bVar2) {
    length = 0;
    bVar2 = getExpFuncParameter((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)
                                fileName,1,&length,(Identifier *)parameters_local,true);
    if (bVar2) {
      fullName._path.field_2._8_8_ = 0;
      args_00 = (StringLiteral *)parameters_local;
      bVar2 = getExpFuncParameter((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)
                                  fileName,2,(int64_t *)(fullName._path.field_2._M_local_buf + 8),
                                  (Identifier *)parameters_local,true);
      if (bVar2) {
        StringLiteral::path(&local_78,(StringLiteral *)start);
        getFullPathName((path *)local_58,&local_78);
        ghc::filesystem::path::~path(&local_78);
        std::error_code::error_code((error_code *)&totalSize);
        file.super_basic_ifstream<char,_std::char_traits<char>_>._512_8_ =
             ghc::filesystem::file_size((path *)local_58,(error_code *)&totalSize);
        if ((fullName._path.field_2._8_8_ == 0) ||
           ((long)file.super_basic_ifstream<char,_std::char_traits<char>_>._512_8_ <
            length + fullName._path.field_2._8_8_)) {
          fullName._path.field_2._8_8_ =
               file.super_basic_ifstream<char,_std::char_traits<char>_>._512_8_ - length;
        }
        mode = std::operator|(_S_in,_S_bin);
        ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
                  ((basic_ifstream<char,_std::char_traits<char>_> *)local_2a8,(path *)local_58,mode)
        ;
        bVar3 = std::ifstream::is_open();
        if ((bVar3 & 1) == 0) {
          Logger::queueError<StringLiteral>((Logger *)0x1,0x2207c5,(char *)start,args_00);
          ExpressionValue::ExpressionValue(__return_storage_ptr__);
          local_2ac = 1;
        }
        else {
          std::fpos<__mbstate_t>::fpos(&local_2c0,length);
          std::istream::seekg(local_2a8,local_2c0._M_off,local_2c0._M_state);
          bVar3 = std::ios::eof();
          if (((bVar3 & 1) == 0) && (bVar3 = std::ios::fail(), (bVar3 & 1) == 0)) {
            result.field_2._M_local_buf[0xf] = '\0';
            std::__cxx11::string::string((string *)&progress);
            for (bytesToRead = 0;
                (result.field_2._M_local_buf[0xf] & 1U) == 0 &&
                (long)bytesToRead < (long)fullName._path.field_2._8_8_;
                bytesToRead = bytesToRead + 0x400) {
              local_708 = 0x400;
              i = fullName._path.field_2._8_8_ - bytesToRead;
              puVar4 = (unsigned_long *)std::min<long>(&local_708,&i);
              local_700 = *puVar4;
              std::istream::read(local_2a8,(long)local_6c8);
              bVar3 = std::ios::fail();
              if ((bVar3 & 1) != 0) {
                Logger::queueError<unsigned_long,StringLiteral>
                          (Error,"Failed to read %d byte(s) from offset 0x%08X of %s",&local_700,
                           (StringLiteral *)start);
                ExpressionValue::ExpressionValue(__return_storage_ptr__);
                goto LAB_00142c13;
              }
              for (local_718 = 0; lVar1 = local_718, args = (Identifier *)std::istream::gcount(),
                  lVar1 < (long)args; local_718 = local_718 + 1) {
                if (local_6c8[local_718] == '\0') {
                  result.field_2._M_local_buf[0xf] = '\x01';
                  break;
                }
                if (local_6c8[local_718] < ' ') {
                  Logger::printError<Identifier>
                            ((Logger *)0x0,0x220826,(char *)parameters_local,args);
                  ExpressionValue::ExpressionValue(__return_storage_ptr__);
                  goto LAB_00142c13;
                }
                std::__cxx11::string::operator+=((string *)&progress,local_6c8[local_718]);
              }
            }
            std::__cxx11::string::string((string *)&local_758,(string *)&progress);
            StringLiteral::StringLiteral(&local_738,&local_758);
            ExpressionValue::ExpressionValue(__return_storage_ptr__,&local_738);
            StringLiteral::~StringLiteral(&local_738);
            std::__cxx11::string::~string((string *)&local_758);
LAB_00142c13:
            local_2ac = 1;
            std::__cxx11::string::~string((string *)&progress);
          }
          else {
            Logger::queueError<long,StringLiteral>
                      (Error,"Invalid offset 0x%08X of %s",&length,(StringLiteral *)start);
            ExpressionValue::ExpressionValue(__return_storage_ptr__);
            local_2ac = 1;
          }
        }
        ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
                  ((basic_ifstream<char,_std::char_traits<char>_> *)local_2a8);
        ghc::filesystem::path::~path((path *)local_58);
      }
      else {
        ExpressionValue::ExpressionValue(__return_storage_ptr__);
      }
    }
    else {
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
  }
  else {
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncReadAscii(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	int64_t start;
	int64_t length;

	GET_PARAM(parameters,0,fileName);
	GET_OPTIONAL_PARAM(parameters,1,start,0);
	GET_OPTIONAL_PARAM(parameters,2,length,0);

	auto fullName = getFullPathName(fileName->path());

	std::error_code error;
	int64_t totalSize = static_cast<int64_t>(fs::file_size(fullName, error));

	if (length == 0 || start+length > totalSize)
		length = totalSize-start;

	fs::ifstream file(fullName, fs::ifstream::in | fs::ifstream::binary);
	if (!file.is_open())
	{
		Logger::queueError(Logger::Error, "Could not open %s", *fileName);
		return ExpressionValue();
	}

	file.seekg(start);
	if (file.eof() || file.fail())
	{
		Logger::queueError(Logger::Error, "Invalid offset 0x%08X of %s", start, *fileName);
		return ExpressionValue();
	}

	char buffer[1024];
	bool stringTerminated = false;
	std::string result;

	for (int64_t progress = 0; !stringTerminated && progress < length; progress += (int64_t) sizeof(buffer))
	{
		auto bytesToRead = (size_t) std::min((int64_t) sizeof(buffer), length - progress);

		file.read(buffer, bytesToRead);
		if (file.fail())
		{
			Logger::queueError(Logger::Error, "Failed to read %d byte(s) from offset 0x%08X of %s", bytesToRead, *fileName);
			return ExpressionValue();
		}

		for (std::streamsize i = 0; i < file.gcount(); i++)
		{
			if (buffer[i] == 0x00)
			{
				stringTerminated = true;
				break;
			}

			if (buffer[i] < 0x20)
			{
				Logger::printError(Logger::Warning, "%s: Non-ASCII character", funcName);
				return ExpressionValue();
			}

			result += buffer[i];
		}
	}

	return ExpressionValue(result);
}